

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::wait_until_impl(size_t mill_sec,callable *func,vector *args)

{
  future_status fVar1;
  lang_error *this;
  proxy *in_RDI;
  future<cs_impl::any> future;
  string *in_stack_ffffffffffffff38;
  __basic_future<cs_impl::any> *in_stack_ffffffffffffff40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff48;
  allocator *paVar2;
  allocator local_89;
  string local_88 [48];
  duration<long,std::ratio<1l,1000l>> local_58 [8];
  type *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  unsigned_long local_10 [2];
  
  std::
  async<cs_impl::runtime_cs_ext::wait_until_impl(unsigned_long,cs::callable_const&,std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)::__0>
            ((launch)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
  std::chrono::_V2::system_clock::now();
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>(local_58,local_10);
  std::chrono::operator+
            (in_stack_ffffffffffffff48,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff40);
  fVar1 = std::__basic_future<cs_impl::any>::
          wait_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (in_stack_ffffffffffffff40,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffff38);
  if (fVar1 != ready) {
    this = (lang_error *)__cxa_allocate_exception(0x20);
    paVar2 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Target function deferred or timeout.",paVar2);
    cs::lang_error::lang_error(this,in_stack_ffffffffffffff38);
    __cxa_throw(this,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  std::future<cs_impl::any>::get((future<cs_impl::any> *)in_RDI);
  std::future<cs_impl::any>::~future((future<cs_impl::any> *)0x4493ab);
  return (var)in_RDI;
}

Assistant:

cs::var wait_until_impl(std::size_t mill_sec, const cs::callable &func, cs::vector &args)
		{
			std::future<cs::var> future = std::async(std::launch::async, [&func, &args]() -> var {
				return wait_worker(func, args);
			});
			if (future.wait_until(std::chrono::system_clock::now() + std::chrono::milliseconds(mill_sec)) !=
			        std::future_status::ready)
				throw cs::lang_error("Target function deferred or timeout.");
			else
				return future.get();
		}